

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
xemmai::t_debug_script::f_replace_break_point
          (t_debug_script *this,size_t a_line,size_t a_column,t_instruction a_old,
          t_instruction a_new)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  byte bVar5;
  unsigned_long uVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  
  p_Var1 = &(this->v_safe_points)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->v_safe_points)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var2 != (_Rb_tree_node_base *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5 >> 7]) {
    bVar5 = -(*(ulong *)(p_Var2 + 1) < a_line) | 1;
    if (*(ulong *)(p_Var2 + 1) == a_line) {
      bVar5 = p_Var2[1]._M_parent != (_Base_ptr)0x0;
    }
    if (-1 < (char)bVar5) {
      p_Var3 = p_Var2;
    }
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    if (a_column == 0) {
LAB_0013196c:
      if (*(void **)p_Var3[1]._M_parent == t_code::v_labels[a_old]) {
        *(void **)p_Var3[1]._M_parent = t_code::v_labels[a_new];
      }
      uVar6 = *(unsigned_long *)(p_Var3 + 1);
      p_Var4 = p_Var3[1]._M_left;
      goto LAB_0013199b;
    }
    do {
      if (*(size_t *)(p_Var3 + 1) != a_line) break;
      if (p_Var3[1]._M_left == (_Base_ptr)a_column) goto LAB_0013196c;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  uVar6 = 0;
  p_Var4 = (_Base_ptr)0x0;
LAB_0013199b:
  pVar7.second = (unsigned_long)p_Var4;
  pVar7.first = uVar6;
  return pVar7;
}

Assistant:

std::pair<size_t, size_t> t_debug_script::f_replace_break_point(size_t a_line, size_t a_column, t_instruction a_old, t_instruction a_new)
{
	auto i = v_safe_points.lower_bound({a_line, nullptr});
	if (i == v_safe_points.end()) return {0, 0};
	if (a_column > 0) {
		while (true) {
			if (i->first.first != a_line) return {0, 0};
			if (i->second == a_column) break;
			if (++i == v_safe_points.end()) return {0, 0};
		}
	}
	auto& code = v_code->f_as<t_code>();
	if (*i->first.second == code.f_p(a_old)) *i->first.second = code.f_p(a_new);
	return {i->first.first, i->second};
}